

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool google::protobuf::internal::MergePartialFromImpl<false>
               (ZeroCopyInputStream *input,MessageLite *msg)

{
  int iVar1;
  undefined4 extraout_var;
  ParseContext ctx;
  char *local_98;
  ZeroCopyInputStream *local_90;
  ParseContext local_88;
  
  local_90 = input;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            (&local_88,io::CodedInputStream::default_recursion_limit_,false,&local_98,&local_90);
  iVar1 = (*msg->_vptr_MessageLite[0xd])(msg,local_98,&local_88);
  return local_88.super_EpsCopyInputStream.last_tag_minus_1_ == 1 &&
         CONCAT44(extraout_var,iVar1) != 0;
}

Assistant:

bool MergePartialFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has no explicit limit (hence we end on end of stream)
  return ptr && ctx.EndedAtEndOfStream();
}